

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

void __thiscall Node::Node(Node *this,NodeType t,shared_ptr<Node> *l,shared_ptr<Node> *r)

{
  this->type = t;
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->left).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>,
             &l->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->right).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>,
             &r->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

Node( NodeType t, std::shared_ptr<Node> l, std::shared_ptr<Node> r ) : type( t ), left( l ), right( r ) {}